

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UIPathTracer.cpp
# Opt level: O0

void UI::PathTracerMenuItems(shared_ptr<PathTracerThread> *path_tracer_thread)

{
  bool bVar1;
  element_type *this;
  PathTracerThread *this_00;
  element_type *peVar2;
  shared_ptr<PathTracerViewer> *path_tracer_viewer;
  bool in_stack_000000ae;
  bool in_stack_000000af;
  char *in_stack_000000b0;
  char *in_stack_000000b8;
  bool in_stack_00000137;
  char *in_stack_00000138;
  
  this = std::__shared_ptr_access<PathTracerThread,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<PathTracerThread,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)0x188463);
  this_00 = (PathTracerThread *)PathTracerThread::GetPathTracerViewerPtr(this);
  bVar1 = ImGui::BeginMenu(in_stack_00000138,in_stack_00000137);
  if (bVar1) {
    std::__shared_ptr_access<PathTracerViewer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<PathTracerViewer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x188494);
    bVar1 = ImGui::MenuItem(in_stack_000000b8,in_stack_000000b0,in_stack_000000af,in_stack_000000ae)
    ;
    if (bVar1) {
      peVar2 = std::__shared_ptr_access<PathTracerViewer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<PathTracerViewer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1884c7);
      peVar2->m_view_type = kColor;
      std::__shared_ptr_access<PathTracerThread,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<PathTracerThread,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1884d7);
      PathTracerThread::UpdateViewer(this_00);
    }
    std::__shared_ptr_access<PathTracerViewer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<PathTracerViewer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1884e9);
    bVar1 = ImGui::MenuItem(in_stack_000000b8,in_stack_000000b0,in_stack_000000af,in_stack_000000ae)
    ;
    if (bVar1) {
      peVar2 = std::__shared_ptr_access<PathTracerViewer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<PathTracerViewer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x18851c);
      peVar2->m_view_type = kAlbedo;
      std::__shared_ptr_access<PathTracerThread,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<PathTracerThread,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x18852c);
      PathTracerThread::UpdateViewer(this_00);
    }
    std::__shared_ptr_access<PathTracerViewer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<PathTracerViewer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x18853e);
    bVar1 = ImGui::MenuItem(in_stack_000000b8,in_stack_000000b0,in_stack_000000af,in_stack_000000ae)
    ;
    if (bVar1) {
      peVar2 = std::__shared_ptr_access<PathTracerViewer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<PathTracerViewer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x188571);
      peVar2->m_view_type = kNormal;
      std::__shared_ptr_access<PathTracerThread,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<PathTracerThread,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x188581);
      PathTracerThread::UpdateViewer(this_00);
    }
    ImGui::EndMenu();
  }
  return;
}

Assistant:

void PathTracerMenuItems(const std::shared_ptr<PathTracerThread> &path_tracer_thread) {
	const auto &path_tracer_viewer = path_tracer_thread->GetPathTracerViewerPtr();
	if (ImGui::BeginMenu("Channel")) {
		if (ImGui::MenuItem("Color", nullptr, path_tracer_viewer->m_view_type == PathTracerViewer::ViewTypes::kColor)) {
			path_tracer_viewer->m_view_type = PathTracerViewer::ViewTypes::kColor;
			path_tracer_thread->UpdateViewer();
		}
		if (ImGui::MenuItem("Albedo", nullptr,
		                    path_tracer_viewer->m_view_type == PathTracerViewer::ViewTypes::kAlbedo)) {
			path_tracer_viewer->m_view_type = PathTracerViewer::ViewTypes::kAlbedo;
			path_tracer_thread->UpdateViewer();
		}
		if (ImGui::MenuItem("Normal", nullptr,
		                    path_tracer_viewer->m_view_type == PathTracerViewer::ViewTypes::kNormal)) {
			path_tracer_viewer->m_view_type = PathTracerViewer::ViewTypes::kNormal;
			path_tracer_thread->UpdateViewer();
		}

		ImGui::EndMenu();
	}
}